

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
handle_post_init(connection<websocketpp::config::asio::transport_config> *this,timer_ptr *post_timer
                ,init_handler *callback,error_code *ec)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *this_00;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  duration_type dVar5;
  error_code *__n;
  weak_ptr<void> local_58;
  error_code local_48;
  time_type local_38;
  time_type local_30;
  
  __n = ec;
  std::error_code::error_code<websocketpp::transport::error::value,void>
            (&local_48,operation_aborted);
  if ((ec->_M_cat == local_48._M_cat) && (ec->_M_value == local_48._M_value)) {
LAB_001a1bca:
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"post_init cancelled",(size_t)__n);
  }
  else {
    peVar2 = (post_timer->
             super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      local_30.__d.__r =
           (duration)
           (peVar2->
           super_basic_io_object<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
           ).implementation_.expiry.__d.__r;
      local_38.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      dVar5 = ::asio::detail::
              chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
              ::subtract(&local_30,&local_38);
      if (dVar5.__r < 0) goto LAB_001a1bca;
    }
    this_00 = (post_timer->
              super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    if (this_00 !=
        (basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
         *)0x0) {
      ::asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
      ::cancel(this_00);
    }
    this_01 = (this->m_alog).
              super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if ((this_01->m_static_channels & 0x400) != 0) {
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (this_01,0x400,"asio connection handle_post_init",(size_t)__n);
    }
    if ((this->m_tcp_post_init_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
      p_Var3 = (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      local_58.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
        }
      }
      if ((this->m_tcp_post_init_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->m_tcp_post_init_handler)._M_invoker)
                ((_Any_data *)&this->m_tcp_post_init_handler,&local_58);
      if (local_58.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_58.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ->_M_weak_count;
          iVar4 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar4 = (local_58.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
          (local_58.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_weak_count = iVar4 + -1;
        }
        if (iVar4 == 1) {
          (*(local_58.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _vptr__Sp_counted_base[3])();
        }
      }
    }
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*callback->_M_invoker)((_Any_data *)callback,ec);
  }
  return;
}

Assistant:

void handle_post_init(timer_ptr post_timer, init_handler callback,
        lib::error_code const & ec)
    {
        if (ec == transport::error::operation_aborted ||
            (post_timer && lib::asio::is_neg(post_timer->expires_from_now())))
        {
            m_alog->write(log::alevel::devel,"post_init cancelled");
            return;
        }

        if (post_timer) {
            post_timer->cancel();
        }

        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection handle_post_init");
        }

        if (m_tcp_post_init_handler) {
            m_tcp_post_init_handler(m_connection_hdl);
        }

        callback(ec);
    }